

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

exr_result_t
validate_channels(_internal_exr_context *f,_internal_exr_part *curpart,exr_attr_chlist_t *channels)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  exr_attr_chlist_entry_t *peVar5;
  exr_result_t eVar6;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr_varargs
  *UNRECOVERED_JUMPTABLE_01;
  long lVar13;
  
  if (channels == (exr_attr_chlist_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar8 = "Missing required channels attribute to validate against";
    eVar6 = 3;
  }
  else if (curpart->dataWindow == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar8 = "request to validate channel list, but data window not set to validate against";
    eVar6 = 0xf;
  }
  else {
    if (0 < (long)channels->num_channels) {
      iVar1 = (curpart->data_window).min.field_0.field_0.x;
      uVar9 = (ulong)iVar1;
      uVar2 = (curpart->data_window).min.field_0.field_0.y;
      lVar11 = ((long)(curpart->data_window).max.field_0.field_0.x - uVar9) + 1;
      lVar12 = ((long)(curpart->data_window).max.field_0.field_0.y - (long)(int)uVar2) + 1;
      peVar5 = channels->entries;
      lVar13 = 0;
      while( true ) {
        uVar3 = *(uint *)(peVar5->reserved + lVar13 + 3);
        if ((long)(int)uVar3 < 1) {
          eVar6 = (*f->print_error)(f,0xe,"channel \'%s\': x subsampling factor is invalid (%d)",
                                    *(undefined8 *)(peVar5->reserved + lVar13 + -0xd),(ulong)uVar3,
                                    f->print_error);
          return eVar6;
        }
        uVar4 = *(uint *)(peVar5->reserved + lVar13 + 7);
        uVar10 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          eVar6 = (*f->print_error)(f,0xe,"channel \'%s\': y subsampling factor is invalid (%d)",
                                    *(undefined8 *)(peVar5->reserved + lVar13 + -0xd),(ulong)uVar4);
          return eVar6;
        }
        if (iVar1 % (int)uVar3 != 0) break;
        if ((int)uVar2 % (int)uVar4 != 0) {
          UNRECOVERED_JUMPTABLE_01 = f->print_error;
          uVar7 = *(undefined8 *)(peVar5->reserved + lVar13 + -0xd);
          pcVar8 = 
          "channel \'%s\': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)"
          ;
          uVar9 = (ulong)uVar2;
          goto LAB_00128bce;
        }
        if (lVar11 % (long)(int)uVar3 != 0) {
          UNRECOVERED_JUMPTABLE_01 = f->print_error;
          uVar7 = *(undefined8 *)(peVar5->reserved + lVar13 + -0xd);
          pcVar8 = 
          "channel \'%s\': row width (%ld) of the data window is not a multiple of the x subsampling factor (%d)"
          ;
          uVar10 = (ulong)uVar3;
LAB_00128c14:
          eVar6 = (*UNRECOVERED_JUMPTABLE_01)(f,0xe,pcVar8,uVar7,lVar11,uVar10);
          return eVar6;
        }
        if (lVar12 % (long)uVar10 != 0) {
          UNRECOVERED_JUMPTABLE_01 = f->print_error;
          uVar7 = *(undefined8 *)(peVar5->reserved + lVar13 + -0xd);
          pcVar8 = 
          "channel \'%s\': column height (%ld) of the data window is not a multiple of the y subsampling factor (%d)"
          ;
          lVar11 = lVar12;
          goto LAB_00128c14;
        }
        lVar13 = lVar13 + 0x20;
        if ((long)channels->num_channels * 0x20 == lVar13) {
          return 0;
        }
      }
      UNRECOVERED_JUMPTABLE_01 = f->print_error;
      uVar7 = *(undefined8 *)(peVar5->reserved + lVar13 + -0xd);
      pcVar8 = 
      "channel \'%s\': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)"
      ;
      uVar10 = (ulong)uVar3;
LAB_00128bce:
      eVar6 = (*UNRECOVERED_JUMPTABLE_01)(f,0xe,pcVar8,uVar7,uVar9,uVar10);
      return eVar6;
    }
    UNRECOVERED_JUMPTABLE = f->report_error;
    pcVar8 = "At least one channel required";
    eVar6 = 6;
  }
  eVar6 = (*UNRECOVERED_JUMPTABLE)(f,eVar6,pcVar8);
  return eVar6;
}

Assistant:

static exr_result_t
validate_channels (
    struct _internal_exr_context* f,
    struct _internal_exr_part*    curpart,
    const exr_attr_chlist_t*      channels)
{
    exr_attr_box2i_t dw;
    int64_t          w, h;

    if (!channels)
        return f->report_error (
            f,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing required channels attribute to validate against");
    if (!curpart->dataWindow)
        return f->report_error (
            f,
            EXR_ERR_NO_ATTR_BY_NAME,
            "request to validate channel list, but data window not set to validate against");

    if (channels->num_channels <= 0)
        return f->report_error (
            f, EXR_ERR_FILE_BAD_HEADER, "At least one channel required");

    dw = curpart->data_window;
    w  = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h  = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    for (int c = 0; c < channels->num_channels; ++c)
    {
        int32_t xsamp = channels->entries[c].x_sampling;
        int32_t ysamp = channels->entries[c].y_sampling;

        if (xsamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': x subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                xsamp);
        if (ysamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': y subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                ysamp);
        if (dw.min.x % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.x,
                xsamp);
        if (dw.min.y % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.y,
                ysamp);
        if (w % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': row width (%" PRId64
                ") of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                w,
                xsamp);
        if (h % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': column height (%" PRId64
                ") of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                h,
                ysamp);
    }

    return EXR_ERR_SUCCESS;
}